

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractNumericFacetValidator.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::AbstractNumericFacetValidator::AbstractNumericFacetValidator
          (AbstractNumericFacetValidator *this,DatatypeValidator *baseValidator,
          RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *facets,int finalSet,
          ValidatorType type,MemoryManager *manager)

{
  DatatypeValidator::DatatypeValidator
            (&this->super_DatatypeValidator,baseValidator,facets,finalSet,type,manager);
  (this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__AbstractNumericFacetValidator_0040c198;
  this->fMaxInclusiveInherited = false;
  this->fMaxExclusiveInherited = false;
  this->fMinInclusiveInherited = false;
  this->fMinExclusiveInherited = false;
  this->fEnumerationInherited = false;
  this->fMaxInclusive = (XMLNumber *)0x0;
  this->fMaxExclusive = (XMLNumber *)0x0;
  this->fMinInclusive = (XMLNumber *)0x0;
  this->fMinExclusive = (XMLNumber *)0x0;
  this->fEnumeration = (RefVectorOf<xercesc_4_0::XMLNumber> *)0x0;
  this->fStrEnumeration = (RefArrayVectorOf<char16_t> *)0x0;
  return;
}

Assistant:

AbstractNumericFacetValidator::AbstractNumericFacetValidator(
                          DatatypeValidator*            const baseValidator
                        , RefHashTableOf<KVStringPair>* const facets
                        , const int                           finalSet
                        , const ValidatorType                 type
                        , MemoryManager* const                manager)
:DatatypeValidator(baseValidator, facets, finalSet, type, manager)
, fMaxInclusiveInherited(false)
, fMaxExclusiveInherited(false)
, fMinInclusiveInherited(false)
, fMinExclusiveInherited(false)
, fEnumerationInherited(false)
, fMaxInclusive(0)
, fMaxExclusive(0)
, fMinInclusive(0)
, fMinExclusive(0)
, fEnumeration(0)
, fStrEnumeration(0)
{
    //do not invoke init() here !!!
}